

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::render::window
               (cvui_block_t *theBlock,Rect *theTitleBar,Rect *theContent,String *theTitle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 local_118;
  cvui_block_t *pcStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f0;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Mat aOverlay;
  
  cv::Mat::Mat(&aOverlay);
  local_b8._0_4_ = theTitleBar->x;
  local_b8._4_4_ = theTitleBar->y;
  uStack_b0._0_4_ = theTitleBar->width;
  uStack_b0._4_4_ = theTitleBar->height;
  local_118 = 0x4052800000000000;
  pcStack_110 = (cvui_block_t *)0x4052800000000000;
  local_108 = 0x4052800000000000;
  uStack_100 = 0;
  cv::rectangle();
  local_c8 = theTitleBar->x + 1;
  iStack_c4 = theTitleBar->y + 1;
  iStack_c0 = theTitleBar->width + -2;
  iStack_bc = theTitleBar->height + -2;
  theTitleBar->x = local_c8;
  theTitleBar->y = iStack_c4;
  theTitleBar->width = iStack_c0;
  theTitleBar->height = iStack_bc;
  local_118 = 0x4040800000000000;
  pcStack_110 = (cvui_block_t *)0x4040800000000000;
  local_108 = 0x4040800000000000;
  uStack_100 = 0;
  cv::rectangle();
  local_108 = 0;
  local_118 = CONCAT44(local_118._4_4_,0x3010000);
  uVar1 = theTitleBar->x;
  uVar2 = theTitleBar->y;
  local_f0 = CONCAT44(uVar2 + 0xc,uVar1 + 5);
  local_a8 = 0x4069c00000000000;
  uStack_a0 = 0x4069c00000000000;
  local_98 = 0x4069c00000000000;
  uStack_90 = 0;
  pcStack_110 = theBlock;
  cv::putText(0x3fd999999999999a,&local_118,theTitle,&local_f0,0,&local_a8,1,0x10,0);
  local_d8._0_4_ = theContent->x;
  local_d8._4_4_ = theContent->y;
  uStack_d0._0_4_ = theContent->width;
  uStack_d0._4_4_ = theContent->height;
  local_118 = 0x4052800000000000;
  pcStack_110 = (cvui_block_t *)0x4052800000000000;
  local_108 = 0x4052800000000000;
  uStack_100 = 0;
  cv::rectangle();
  local_e8 = theContent->x + 1;
  iStack_e4 = theContent->y + 1;
  iStack_e0 = theContent->width + -2;
  iStack_dc = theContent->height + -2;
  theContent->x = local_e8;
  theContent->y = iStack_e4;
  theContent->width = iStack_e0;
  theContent->height = iStack_dc;
  local_118 = 0x4048800000000000;
  pcStack_110 = (cvui_block_t *)0x4048800000000000;
  local_108 = 0x4048800000000000;
  uStack_100 = 0;
  cv::rectangle();
  cv::Mat::~Mat(&aOverlay);
  return;
}

Assistant:

void window(cvui_block_t& theBlock, cv::Rect& theTitleBar, cv::Rect& theContent, const cv::String& theTitle) {
		bool aTransparecy = false;
		double aAlpha = 0.3;
		cv::Mat aOverlay;

		// Render the title bar.
		// First the border
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x4A, 0x4A, 0x4A));
		// then the inside
		theTitleBar.x++; theTitleBar.y++; theTitleBar.width -= 2; theTitleBar.height -= 2;
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x21, 0x21, 0x21), CVUI_FILLED);

		// Render title text.
		cv::Point aPos(theTitleBar.x + 5, theTitleBar.y + 12);
		cv::putText(theBlock.where, theTitle, aPos, cv::FONT_HERSHEY_SIMPLEX, 0.4, cv::Scalar(0xCE, 0xCE, 0xCE), 1, CVUI_ANTIALISED);

		// Render the body.
		// First the border.
		cv::rectangle(theBlock.where, theContent, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Then the filling.
		theContent.x++; theContent.y++; theContent.width -= 2; theContent.height -= 2;

		if (aTransparecy) {
			theBlock.where.copyTo(aOverlay);
			cv::rectangle(aOverlay, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
			cv::addWeighted(aOverlay, aAlpha, theBlock.where, 1.0 - aAlpha, 0.0, theBlock.where);

		} else {
			cv::rectangle(theBlock.where, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
		}
	}